

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ConvolutionLayerParams::ConvolutionLayerParams
          (ConvolutionLayerParams *this,ConvolutionLayerParams *from)

{
  void *pvVar1;
  WeightParams *pWVar2;
  uint64 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  WeightParams *pWVar6;
  ValidPadding *this_00;
  ValidPadding *from_00;
  SamePadding *this_01;
  SamePadding *from_01;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ConvolutionLayerParams_00395dd0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->kernelsize_,&from->kernelsize_);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField(&this->stride_,&from->stride_);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->dilationfactor_,&from->dilationfactor_);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->outputshape_,&from->outputshape_);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pWVar2 = from->weights_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    pWVar6 = (WeightParams *)0x0;
  }
  else {
    pWVar6 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar6,pWVar2);
  }
  this->weights_ = pWVar6;
  pWVar2 = from->bias_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    pWVar6 = (WeightParams *)0x0;
  }
  else {
    pWVar6 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar6,pWVar2);
  }
  this->bias_ = pWVar6;
  uVar3 = from->kernelchannels_;
  uVar4 = *(undefined8 *)((long)&from->kernelchannels_ + 2);
  uVar5 = *(undefined8 *)((long)&from->ngroups_ + 2);
  this->outputchannels_ = from->outputchannels_;
  this->kernelchannels_ = uVar3;
  *(undefined8 *)((long)&this->kernelchannels_ + 2) = uVar4;
  *(undefined8 *)((long)&this->ngroups_ + 2) = uVar5;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 0x33) {
    this_01 = mutable_same(this);
    from_01 = same(from);
    SamePadding::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 0x32) {
    this_00 = mutable_valid(this);
    from_00 = valid(from);
    ValidPadding::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

ConvolutionLayerParams::ConvolutionLayerParams(const ConvolutionLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      kernelsize_(from.kernelsize_),
      stride_(from.stride_),
      dilationfactor_(from.dilationfactor_),
      outputshape_(from.outputshape_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_weights()) {
    weights_ = new ::CoreML::Specification::WeightParams(*from.weights_);
  } else {
    weights_ = NULL;
  }
  if (from.has_bias()) {
    bias_ = new ::CoreML::Specification::WeightParams(*from.bias_);
  } else {
    bias_ = NULL;
  }
  ::memcpy(&outputchannels_, &from.outputchannels_,
    reinterpret_cast<char*>(&hasbias_) -
    reinterpret_cast<char*>(&outputchannels_) + sizeof(hasbias_));
  clear_has_ConvolutionPaddingType();
  switch (from.ConvolutionPaddingType_case()) {
    case kValid: {
      mutable_valid()->::CoreML::Specification::ValidPadding::MergeFrom(from.valid());
      break;
    }
    case kSame: {
      mutable_same()->::CoreML::Specification::SamePadding::MergeFrom(from.same());
      break;
    }
    case CONVOLUTIONPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ConvolutionLayerParams)
}